

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpStreamReader.cpp
# Opt level: O2

string * __thiscall
MLPStreamReader::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,MLPStreamReader *this)

{
  MlpSubType MVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  ostringstream str;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  MVar1 = (this->super_MLPCodec).m_subType;
  pcVar3 = "UNKNOWN";
  if (MVar1 == stMLP) {
    pcVar3 = "MLP";
  }
  pcVar4 = "TRUE-HD";
  if (MVar1 != stTRUEHD) {
    pcVar4 = pcVar3;
  }
  std::operator<<((ostream *)local_190,pcVar4);
  if ((this->super_MLPCodec).m_substreams == '\x04') {
    std::operator<<((ostream *)local_190," + ATMOS");
  }
  std::operator<<((ostream *)local_190,". ");
  poVar2 = std::operator<<((ostream *)local_190,"Peak bitrate: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_MLPCodec).m_bitrate / 1000);
  std::operator<<(poVar2,"Kbps ");
  poVar2 = std::operator<<((ostream *)local_190,"Sample Rate: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_MLPCodec).m_samplerate / 1000);
  std::operator<<(poVar2,"KHz ");
  poVar2 = std::operator<<((ostream *)local_190,"Channels: ");
  std::ostream::operator<<(poVar2,(uint)(this->super_MLPCodec).m_channels);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

const std::string MLPStreamReader::getStreamInfo()
{
    std::ostringstream str;

    if (m_subType == MlpSubType::stTRUEHD)
        str << "TRUE-HD";
    else if (m_subType == MlpSubType::stMLP)
        str << "MLP";
    else
        str << "UNKNOWN";

    if (m_substreams == 4)
        str << " + ATMOS";
    str << ". ";
    str << "Peak bitrate: " << m_bitrate / 1000 << "Kbps ";
    str << "Sample Rate: " << m_samplerate / 1000 << "KHz ";
    str << "Channels: " << static_cast<int>(m_channels);
    return str.str();
}